

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCryptoHash.cxx
# Opt level: O2

auto_ptr<cmCryptoHash> __thiscall cmCryptoHash::New(cmCryptoHash *this,char *algo)

{
  int iVar1;
  cmCryptoHashMD5 *this_00;
  
  iVar1 = strcmp(algo,"MD5");
  if (iVar1 == 0) {
    this_00 = (cmCryptoHashMD5 *)operator_new(0x10);
    cmCryptoHashMD5::cmCryptoHashMD5(this_00);
  }
  else {
    iVar1 = strcmp(algo,"SHA1");
    if (iVar1 == 0) {
      this_00 = (cmCryptoHashMD5 *)operator_new(0x10);
      cmCryptoHashSHA1::cmCryptoHashSHA1((cmCryptoHashSHA1 *)this_00);
    }
    else {
      iVar1 = strcmp(algo,"SHA224");
      if (iVar1 == 0) {
        this_00 = (cmCryptoHashMD5 *)operator_new(0x10);
        cmCryptoHashSHA224::cmCryptoHashSHA224((cmCryptoHashSHA224 *)this_00);
      }
      else {
        iVar1 = strcmp(algo,"SHA256");
        if (iVar1 == 0) {
          this_00 = (cmCryptoHashMD5 *)operator_new(0x10);
          cmCryptoHashSHA256::cmCryptoHashSHA256((cmCryptoHashSHA256 *)this_00);
        }
        else {
          iVar1 = strcmp(algo,"SHA384");
          if (iVar1 == 0) {
            this_00 = (cmCryptoHashMD5 *)operator_new(0x10);
            cmCryptoHashSHA384::cmCryptoHashSHA384((cmCryptoHashSHA384 *)this_00);
          }
          else {
            iVar1 = strcmp(algo,"SHA512");
            if (iVar1 == 0) {
              this_00 = (cmCryptoHashMD5 *)operator_new(0x10);
              cmCryptoHashSHA512::cmCryptoHashSHA512((cmCryptoHashSHA512 *)this_00);
            }
            else {
              this_00 = (cmCryptoHashMD5 *)0x0;
            }
          }
        }
      }
    }
  }
  this->_vptr_cmCryptoHash = (_func_int **)this_00;
  return (auto_ptr<cmCryptoHash>)this;
}

Assistant:

cmsys::auto_ptr<cmCryptoHash> cmCryptoHash::New(const char* algo)
{
  if(strcmp(algo,"MD5") == 0)
    { return cmsys::auto_ptr<cmCryptoHash>(new cmCryptoHashMD5); }
  else if(strcmp(algo,"SHA1") == 0)
    { return cmsys::auto_ptr<cmCryptoHash>(new cmCryptoHashSHA1); }
  else if(strcmp(algo,"SHA224") == 0)
    { return cmsys::auto_ptr<cmCryptoHash>(new cmCryptoHashSHA224); }
  else if(strcmp(algo,"SHA256") == 0)
    { return cmsys::auto_ptr<cmCryptoHash>(new cmCryptoHashSHA256); }
  else if(strcmp(algo,"SHA384") == 0)
    { return cmsys::auto_ptr<cmCryptoHash>(new cmCryptoHashSHA384); }
  else if(strcmp(algo,"SHA512") == 0)
    { return cmsys::auto_ptr<cmCryptoHash>(new cmCryptoHashSHA512); }
  else
    { return cmsys::auto_ptr<cmCryptoHash>(0); }
}